

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_VisMF.cpp
# Opt level: O0

void amrex::VisMF::AsyncWriteDoit
               (FabArray<amrex::FArrayBox> *mf,string *mf_name,bool is_rvalue,bool valid_cells_only)

{
  undefined8 uVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  element_type *peVar5;
  Arena *pAVar6;
  Long LVar7;
  streamoff sVar8;
  long *plVar9;
  FabArrayBase *__fn;
  RealDescriptor *this;
  byte in_CL;
  Box *pBVar10;
  byte in_DL;
  void *__child_stack;
  string *in_RSI;
  FabArrayBase *in_RDI;
  undefined1 *__arg;
  IntVect IVar11;
  undefined1 auVar12 [16];
  shared_ptr<amrex::FABio> fabio;
  value_type *new_fab;
  Box bx_1;
  MFIter mfi_1;
  shared_ptr<amrex::Vector<amrex::FArrayBox,_std::allocator<amrex::FArrayBox>_>_> myfabs;
  shared_ptr<amrex::Vector<long,_std::allocator<long>_>_> globaldata;
  pair<double,_double> mm;
  int icomp;
  FArrayBox *header_fab;
  FArrayBox valid_fab;
  stringstream hss;
  Box *bx;
  FArrayBox *fab;
  MFIter mfi;
  FABio *fio;
  char *pld;
  int64_t total_bytes;
  bool strip_ghost;
  bool run_on_device;
  bool data_on_device;
  Vector<long,_std::allocator<long>_> localdata;
  Long n_local_nums;
  Long n_fab_nums;
  Long n_fab_int64;
  Long n_fab_reals;
  int ncomp;
  int n_global_fabs;
  int n_local_fabs;
  int sizeof_int64_over_real;
  shared_ptr<amrex::VisMF::Header> hdr;
  RealDescriptor *whichRD;
  int io_proc;
  int nprocs;
  int myproc;
  DistributionMapping *dm;
  MFIter *in_stack_fffffffffffffa38;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffffa40;
  anon_class_136_11_ba49adb7 *this_00;
  Box *in_stack_fffffffffffffa48;
  anon_class_136_11_ba49adb7 *__f;
  MFIter *in_stack_fffffffffffffa50;
  function<void_()> *this_01;
  Box *in_stack_fffffffffffffa58;
  vector<amrex::FArrayBox,_std::allocator<amrex::FArrayBox>_> *in_stack_fffffffffffffa60;
  FabArrayBase *in_stack_fffffffffffffa68;
  MFIter *in_stack_fffffffffffffa70;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffffa78;
  Box *destbox;
  BaseFab<double> *in_stack_fffffffffffffa98;
  undefined4 in_stack_fffffffffffffaa0;
  int in_stack_fffffffffffffaa4;
  FArrayBox *local_540;
  bool local_517;
  bool local_516;
  bool local_514;
  byte local_512;
  int in_stack_fffffffffffffb14;
  undefined4 in_stack_fffffffffffffb18;
  undefined4 in_stack_fffffffffffffb1c;
  int in_stack_fffffffffffffb20;
  int in_stack_fffffffffffffb24;
  undefined1 local_4d8 [32];
  string local_4b8 [112];
  reference local_448;
  Arena *local_440;
  int local_438;
  MFIter local_418;
  pair<double,_double> local_398;
  int local_384;
  undefined1 local_380 [16];
  FArrayBox *local_370;
  FArrayBox local_368;
  stringstream local_320 [16];
  undefined1 local_310 [380];
  undefined1 local_194 [28];
  undefined1 *local_178;
  FArrayBox *local_170;
  MFIter local_168;
  FABio *local_108;
  double *local_100;
  Box *local_f8;
  int local_f0 [3];
  undefined8 local_dc;
  int local_d4;
  bool local_cf;
  bool local_ce;
  byte local_cd;
  long local_a0;
  long local_98;
  undefined8 local_90;
  long local_88;
  uint local_80;
  int local_7c;
  int local_78;
  undefined4 local_74;
  IntVect local_70;
  undefined1 local_61;
  undefined4 local_60;
  undefined4 local_5c;
  RealDescriptor *local_48;
  int local_3c;
  int local_38;
  int local_34;
  DistributionMapping *local_30;
  byte local_22;
  byte local_21;
  string *local_20;
  FabArrayBase *local_18;
  undefined4 local_c;
  undefined8 *local_8;
  
  local_21 = in_DL & 1;
  local_22 = in_CL & 1;
  local_20 = in_RSI;
  local_18 = in_RDI;
  local_30 = FabArrayBase::DistributionMap(in_RDI);
  local_34 = ParallelDescriptor::MyProc();
  local_38 = ParallelDescriptor::NProcs();
  local_3c = local_38 + -1;
  local_48 = FPC::NativeRealDescriptor();
  local_5c = 1;
  local_60 = 1;
  local_61 = 0;
  __arg = &local_61;
  std::
  make_shared<amrex::VisMF::Header,amrex::FabArray<amrex::FArrayBox>const&,amrex::VisMF::How,amrex::VisMF::Header::Version,bool>
            (in_stack_fffffffffffffa78,(How *)in_stack_fffffffffffffa70,
             (Version *)in_stack_fffffffffffffa68,(bool *)in_stack_fffffffffffffa60);
  if ((local_22 & 1) != 0) {
    IntVect::IntVect(&local_70,0);
    peVar5 = std::
             __shared_ptr_access<amrex::VisMF::Header,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<amrex::VisMF::Header,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x12216ba);
    *(undefined8 *)(peVar5->m_ngrow).vect = local_70.vect._0_8_;
    (peVar5->m_ngrow).vect[2] = local_70.vect[2];
  }
  local_74 = 1;
  local_78 = FabArrayBase::local_size((FabArrayBase *)0x12216e8);
  local_7c = FabArrayBase::size((FabArrayBase *)0x12216fc);
  local_80 = FabArrayBase::nComp(local_18);
  local_88 = (long)(int)(local_80 * 2);
  local_90 = 1;
  local_98 = local_88 + 1;
  local_a0 = local_98 * local_78 + 1;
  std::allocator<long>::allocator((allocator<long> *)0x122178d);
  Vector<long,_std::allocator<long>_>::vector
            ((Vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffa40,
             (size_type)in_stack_fffffffffffffa38,(allocator_type *)0x12217aa);
  std::allocator<long>::~allocator((allocator<long> *)0x12217b9);
  pAVar6 = FabArray<amrex::FArrayBox>::arena((FabArray<amrex::FArrayBox> *)0x12217c6);
  uVar3 = (*pAVar6->_vptr_Arena[7])();
  local_512 = 1;
  if ((uVar3 & 1) == 0) {
    pAVar6 = FabArray<amrex::FArrayBox>::arena((FabArray<amrex::FArrayBox> *)0x12217ff);
    iVar4 = (*pAVar6->_vptr_Arena[8])();
    local_512 = (byte)iVar4;
  }
  local_cd = local_512 & 1;
  local_514 = false;
  if (local_cd != 0) {
    local_514 = Gpu::inLaunchRegion();
  }
  local_ce = local_514;
  local_516 = false;
  if ((local_22 & 1) != 0) {
    IVar11 = FabArrayBase::nGrowVect(local_18);
    local_f0._0_8_ = IVar11.vect._0_8_;
    local_dc._0_4_ = local_f0[0];
    local_dc._4_4_ = local_f0[1];
    uVar1 = local_dc;
    local_f0[2] = IVar11.vect[2];
    local_d4 = local_f0[2];
    local_8 = &local_dc;
    local_c = 0;
    local_dc._0_4_ = IVar11.vect[0];
    local_517 = true;
    if (((int)local_dc == 0) &&
       (local_dc._4_4_ = IVar11.vect[1], local_517 = true, local_dc._4_4_ == 0)) {
      local_517 = local_f0[2] != 0;
    }
    local_516 = local_517;
    local_f0 = IVar11.vect;
    local_dc = uVar1;
  }
  local_cf = local_516;
  local_f8 = (Box *)0x0;
  LVar7 = Vector<long,_std::allocator<long>_>::size
                    ((Vector<long,_std::allocator<long>_> *)0x1221975);
  if (1 < LVar7) {
    local_100 = (double *)
                Vector<long,_std::allocator<long>_>::operator[]
                          ((Vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffa40,
                           (size_type)in_stack_fffffffffffffa38);
    local_108 = FArrayBox::getFABio();
    MFIter::MFIter(in_stack_fffffffffffffa70,in_stack_fffffffffffffa68,
                   (uchar)((ulong)in_stack_fffffffffffffa60 >> 0x38));
    while( true ) {
      bVar2 = MFIter::isValid(&local_168);
      if (!bVar2) break;
      *local_100 = (double)local_f8;
      local_100 = local_100 + 1;
      local_170 = FabArray<amrex::FArrayBox>::operator[]
                            (in_stack_fffffffffffffa40,in_stack_fffffffffffffa38);
      MFIter::validbox(in_stack_fffffffffffffa50);
      local_178 = local_194;
      std::__cxx11::stringstream::stringstream(local_320);
      __arg = (undefined1 *)0x0;
      FArrayBox::FArrayBox
                ((FArrayBox *)in_stack_fffffffffffffa50,in_stack_fffffffffffffa48,
                 (int)((ulong)in_stack_fffffffffffffa40 >> 0x20),
                 SUB81((ulong)in_stack_fffffffffffffa40 >> 0x18,0),
                 SUB81((ulong)in_stack_fffffffffffffa40 >> 0x10,0),
                 (Arena *)in_stack_fffffffffffffa38);
      if ((local_cf & 1U) == 0) {
        local_540 = local_170;
      }
      else {
        local_540 = &local_368;
      }
      local_370 = local_540;
      (*local_108->_vptr_FABio[6])(local_108,local_310,local_540,(ulong)local_80);
      auVar12 = std::ostream::tellp();
      local_380 = auVar12;
      sVar8 = std::fpos::operator_cast_to_long((fpos *)local_380);
      local_f8 = (Box *)((long)(local_f8->smallend).vect + sVar8);
      in_stack_fffffffffffffa98 =
           (BaseFab<double> *)BaseFab<double>::size((BaseFab<double> *)in_stack_fffffffffffffa40);
      in_stack_fffffffffffffaa4 = RealDescriptor::numBytes((RealDescriptor *)0x1221bce);
      local_f8 = (Box *)((long)in_stack_fffffffffffffa98 * (long)in_stack_fffffffffffffaa4 +
                        (long)local_f8);
      for (local_384 = 0; local_384 < (int)local_80; local_384 = local_384 + 1) {
        if ((local_ce & 1U) == 0) {
          local_398 = BaseFab<double>::minmax<(amrex::RunOn)1>
                                ((BaseFab<double> *)
                                 CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
                                 (Box *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18
                                                ),in_stack_fffffffffffffb14);
        }
        else {
          local_398 = BaseFab<double>::minmax<(amrex::RunOn)0>
                                ((BaseFab<double> *)
                                 CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
                                 (Box *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18
                                                ),in_stack_fffffffffffffb14);
        }
        *local_100 = local_398.first;
        local_100[1] = local_398.second;
        local_100 = local_100 + 2;
      }
      FArrayBox::~FArrayBox((FArrayBox *)0x1221d3b);
      std::__cxx11::stringstream::~stringstream(local_320);
      MFIter::operator++(&local_168);
    }
    MFIter::~MFIter((MFIter *)in_stack_fffffffffffffa40);
  }
  pBVar10 = local_f8;
  plVar9 = Vector<long,_std::allocator<long>_>::operator[]
                     ((Vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffa40,
                      (size_type)in_stack_fffffffffffffa38);
  *plVar9 = (long)pBVar10;
  destbox = pBVar10;
  std::make_shared<amrex::Vector<long,std::allocator<long>>>();
  if (local_38 == 1) {
    std::
    __shared_ptr_access<amrex::Vector<long,_std::allocator<long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator*((__shared_ptr_access<amrex::Vector<long,_std::allocator<long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 *)in_stack_fffffffffffffa40);
    Vector<long,_std::allocator<long>_>::operator=
              ((Vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffa40,
               (Vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffa38);
  }
  std::make_shared<amrex::Vector<amrex::FArrayBox,std::allocator<amrex::FArrayBox>>>();
  __fn = local_18;
  MFIter::MFIter(in_stack_fffffffffffffa70,in_stack_fffffffffffffa68,
                 (uchar)((ulong)in_stack_fffffffffffffa60 >> 0x38));
  while( true ) {
    bVar2 = MFIter::isValid(&local_418);
    iVar4 = (int)pBVar10;
    if (!bVar2) break;
    if ((local_cf & 1U) == 0) {
      MFIter::fabbox(in_stack_fffffffffffffa50);
    }
    else {
      MFIter::validbox(in_stack_fffffffffffffa50);
    }
    if (((local_21 & 1) == 0) || ((local_cf & 1U) != 0)) {
      std::
      __shared_ptr_access<amrex::Vector<amrex::FArrayBox,_std::allocator<amrex::FArrayBox>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<amrex::Vector<amrex::FArrayBox,_std::allocator<amrex::FArrayBox>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1221f0e);
      local_438 = FabArrayBase::nComp(local_18);
      local_440 = The_Cpu_Arena();
      pBVar10 = (Box *)&local_440;
      std::vector<amrex::FArrayBox,std::allocator<amrex::FArrayBox>>::
      emplace_back<amrex::Box&,int,amrex::Arena*>
                (in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,
                 (int *)in_stack_fffffffffffffa50,(Arena **)in_stack_fffffffffffffa48);
      std::
      __shared_ptr_access<amrex::Vector<amrex::FArrayBox,_std::allocator<amrex::FArrayBox>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<amrex::Vector<amrex::FArrayBox,_std::allocator<amrex::FArrayBox>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1221f71);
      local_448 = std::vector<amrex::FArrayBox,_std::allocator<amrex::FArrayBox>_>::back
                            ((vector<amrex::FArrayBox,_std::allocator<amrex::FArrayBox>_> *)
                             in_stack_fffffffffffffa40);
      __fn = (FabArrayBase *)
             FabArray<amrex::FArrayBox>::operator[]
                       (in_stack_fffffffffffffa40,in_stack_fffffffffffffa38);
      BaseFab<double>::copy<(amrex::RunOn)1>
                ((BaseFab<double> *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
                 in_stack_fffffffffffffa98,destbox);
    }
    else {
      std::
      __shared_ptr_access<amrex::Vector<amrex::FArrayBox,_std::allocator<amrex::FArrayBox>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<amrex::Vector<amrex::FArrayBox,_std::allocator<amrex::FArrayBox>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1221ead);
      __fn = (FabArrayBase *)
             FabArray<amrex::FArrayBox>::operator[]
                       (in_stack_fffffffffffffa40,in_stack_fffffffffffffa38);
      std::vector<amrex::FArrayBox,_std::allocator<amrex::FArrayBox>_>::
      emplace_back<amrex::FArrayBox>
                ((vector<amrex::FArrayBox,_std::allocator<amrex::FArrayBox>_> *)
                 in_stack_fffffffffffffa50,(FArrayBox *)in_stack_fffffffffffffa48);
    }
    MFIter::operator++(&local_418);
  }
  MFIter::~MFIter((MFIter *)in_stack_fffffffffffffa40);
  operator_new(0x10);
  this = FPC::NativeRealDescriptor();
  RealDescriptor::clone(this,(__fn *)__fn,__child_stack,iVar4,__arg);
  FABio_binary::FABio_binary
            ((FABio_binary *)in_stack_fffffffffffffa40,(RealDescriptor *)in_stack_fffffffffffffa38);
  std::shared_ptr<amrex::FABio>::shared_ptr<amrex::FABio_binary,void>
            ((shared_ptr<amrex::FABio> *)in_stack_fffffffffffffa40,
             (FABio_binary *)in_stack_fffffffffffffa38);
  this_00 = (anon_class_136_11_ba49adb7 *)&stack0xfffffffffffffb08;
  std::shared_ptr<amrex::VisMF::Header>::shared_ptr
            ((shared_ptr<amrex::VisMF::Header> *)this_00,
             (shared_ptr<amrex::VisMF::Header> *)in_stack_fffffffffffffa38);
  __f = (anon_class_136_11_ba49adb7 *)local_4d8;
  DistributionMapping::DistributionMapping
            ((DistributionMapping *)this_00,(DistributionMapping *)in_stack_fffffffffffffa38);
  this_01 = (function<void_()> *)(local_4d8 + 0x10);
  std::shared_ptr<amrex::Vector<long,_std::allocator<long>_>_>::shared_ptr
            ((shared_ptr<amrex::Vector<long,_std::allocator<long>_>_> *)this_00,
             (shared_ptr<amrex::Vector<long,_std::allocator<long>_>_> *)in_stack_fffffffffffffa38);
  std::__cxx11::string::string(local_4b8,local_20);
  std::shared_ptr<amrex::Vector<amrex::FArrayBox,_std::allocator<amrex::FArrayBox>_>_>::shared_ptr
            ((shared_ptr<amrex::Vector<amrex::FArrayBox,_std::allocator<amrex::FArrayBox>_>_> *)
             this_00,(shared_ptr<amrex::Vector<amrex::FArrayBox,_std::allocator<amrex::FArrayBox>_>_>
                      *)in_stack_fffffffffffffa38);
  std::shared_ptr<amrex::FABio>::shared_ptr
            ((shared_ptr<amrex::FABio> *)this_00,
             (shared_ptr<amrex::FABio> *)in_stack_fffffffffffffa38);
  std::function<void()>::
  function<amrex::VisMF::AsyncWriteDoit(amrex::FabArray<amrex::FArrayBox>const&,std::__cxx11::string_const&,bool,bool)::__0,void>
            (this_01,__f);
  AsyncOut::Submit((function<void_()> *)0x1222118);
  std::function<void_()>::~function((function<void_()> *)0x1222127);
  AsyncWriteDoit(amrex::FabArray<amrex::FArrayBox>const&,std::__cxx11::string_const&,bool,bool)::$_0
  ::~__0(this_00);
  std::shared_ptr<amrex::FABio>::~shared_ptr((shared_ptr<amrex::FABio> *)0x1222141);
  std::shared_ptr<amrex::Vector<amrex::FArrayBox,_std::allocator<amrex::FArrayBox>_>_>::~shared_ptr
            ((shared_ptr<amrex::Vector<amrex::FArrayBox,_std::allocator<amrex::FArrayBox>_>_> *)
             0x122214e);
  std::shared_ptr<amrex::Vector<long,_std::allocator<long>_>_>::~shared_ptr
            ((shared_ptr<amrex::Vector<long,_std::allocator<long>_>_> *)0x122215b);
  Vector<long,_std::allocator<long>_>::~Vector((Vector<long,_std::allocator<long>_> *)0x1222168);
  std::shared_ptr<amrex::VisMF::Header>::~shared_ptr((shared_ptr<amrex::VisMF::Header> *)0x1222175);
  return;
}

Assistant:

void
VisMF::AsyncWriteDoit (const FabArray<FArrayBox>& mf, const std::string& mf_name,
                       bool is_rvalue, bool valid_cells_only)
{
    BL_PROFILE("VisMF::AsyncWrite()");

    AMREX_ASSERT(mf_name[mf_name.length() - 1] != '/');
    static_assert(sizeof(int64_t) == sizeof(Real)*2 || sizeof(int64_t) == sizeof(Real),
                  "AsyncWrite: unsupported Real size");

    const DistributionMapping& dm = mf.DistributionMap();

    const int myproc = ParallelDescriptor::MyProc();
    const int nprocs = ParallelDescriptor::NProcs();
    const int io_proc = nprocs - 1;

    RealDescriptor const& whichRD = FPC::NativeRealDescriptor();

    auto hdr = std::make_shared<VisMF::Header>(mf, VisMF::NFiles, VisMF::Header::Version_v1, false);
    if (valid_cells_only) hdr->m_ngrow = IntVect(0);

    constexpr int sizeof_int64_over_real = sizeof(int64_t) / sizeof(Real);
    const int n_local_fabs = mf.local_size();
    const int n_global_fabs = mf.size();
    const int ncomp = mf.nComp();
    const Long n_fab_reals = 2*ncomp;
    const Long n_fab_int64 = 1;
    const Long n_fab_nums = (n_fab_reals/sizeof_int64_over_real) + n_fab_int64;
    const Long n_local_nums = n_fab_nums * n_local_fabs + 1;
    Vector<int64_t> localdata(n_local_nums);

    bool data_on_device = mf.arena()->isManaged() || mf.arena()->isDevice();
    bool run_on_device = data_on_device && Gpu::inLaunchRegion();

    bool strip_ghost = valid_cells_only && mf.nGrowVect() != 0;

    int64_t total_bytes = 0;
    if (localdata.size() > 1) {
        char* pld = (char*)(&(localdata[1]));
        const FABio& fio = FArrayBox::getFABio();
        for (MFIter mfi(mf); mfi.isValid(); ++mfi)
        {
            std::memcpy(pld, &total_bytes, sizeof(int64_t));
            pld += sizeof(int64_t);

            const FArrayBox& fab = mf[mfi];
            const Box& bx = mfi.validbox();

            std::stringstream hss;
            FArrayBox valid_fab(bx, ncomp, false);
            FArrayBox const& header_fab = (strip_ghost) ? valid_fab : fab;
            fio.write_header(hss, header_fab, ncomp);
            total_bytes += static_cast<std::streamoff>(hss.tellp());
            total_bytes += header_fab.size() * whichRD.numBytes();

            // compute min and max
            for (int icomp = 0; icomp < ncomp; ++icomp) {
                auto mm = (run_on_device) ? fab.minmax<RunOn::Device>(bx,icomp)
                                          : fab.minmax<RunOn::Host  >(bx,icomp);
                std::memcpy(pld, &(mm.first), sizeof(Real));
                pld += sizeof(Real);
                std::memcpy(pld, &(mm.second), sizeof(Real));
                pld += sizeof(Real);
            }
        }
    }
    localdata[0] = total_bytes;

    auto globaldata = std::make_shared<Vector<int64_t> >();
    if (nprocs == 1) {
        *globaldata = std::move(localdata);
    }
#ifdef BL_USE_MPI
    else {
        const Long n_global_nums = n_fab_nums * n_global_fabs + nprocs;
        Vector<int> rcnt, rdsp;
        if (myproc == io_proc) {
            globaldata->resize(n_global_nums);
            rcnt.resize(nprocs,1);
            rdsp.resize(nprocs,0);
            for (int k = 0; k < n_global_fabs; ++k) {
                int rank = dm[k];
                rcnt[rank] += n_fab_nums;
            }
            std::partial_sum(rcnt.begin(), rcnt.end()-1, rdsp.begin()+1);
        } else {
            globaldata->resize(1,0);
            rcnt.resize(1,0);
            rdsp.resize(1,0);
        }
        BL_MPI_REQUIRE(MPI_Gatherv(localdata.data(), localdata.size(), MPI_INT64_T,
                                   globaldata->data(), rcnt.data(), rdsp.data(), MPI_INT64_T,
                                   io_proc, ParallelDescriptor::Communicator()));
    }
#endif

    auto myfabs = std::make_shared<Vector<FArrayBox> >();
    for (MFIter mfi(mf); mfi.isValid(); ++mfi) {
        Box bx = strip_ghost ? mfi.validbox() : mfi.fabbox();
#ifdef AMREX_USE_GPU
        if (data_on_device) {
            myfabs->emplace_back(bx, mf.nComp(), The_Pinned_Arena());
            auto& new_fab = myfabs->back();
            if (strip_ghost) {
                new_fab.copy<RunOn::Device>(mf[mfi], bx);
            } else {
                Gpu::dtoh_memcpy_async(new_fab.dataPtr(), mf[mfi].dataPtr(), new_fab.size()*sizeof(Real));
            }
        } else
#endif
        {
            if (is_rvalue && ! strip_ghost) {
                myfabs->emplace_back(std::move(const_cast<FArrayBox&>(mf[mfi])));
            } else {
                myfabs->emplace_back(bx, mf.nComp(), The_Cpu_Arena());
                auto& new_fab = myfabs->back();
                new_fab.copy<RunOn::Host>(mf[mfi], bx);
            }
        }
    }

    std::shared_ptr<FABio> fabio(new FABio_binary(FPC::NativeRealDescriptor().clone()));

    AsyncOut::Submit([=] ()
    {
        if (myproc == io_proc)
        {
            hdr->m_fod.resize(n_global_fabs);
            hdr->m_min.resize(n_global_fabs);
            hdr->m_max.resize(n_global_fabs);
            hdr->m_famin.clear();
            hdr->m_famax.clear();
            hdr->m_famin.resize(ncomp,std::numeric_limits<Real>::max());
            hdr->m_famax.resize(ncomp,std::numeric_limits<Real>::lowest());

            Vector<int64_t> nbytes_on_rank(nprocs,-1L);
            Vector<Vector<int> > gidx(nprocs);
            for (int k = 0; k < n_global_fabs; ++k) {
                int rank = dm[k];
                gidx[rank].push_back(k);
            }

            auto pgd = (char*)(globaldata->data());
            {
                int rank = 0, lidx = 0;
                for (int j = 0; j < n_global_fabs; ++j)
                {
                    int k = -1;
                    do {
                        if (lidx < gidx[rank].size()) {
                            k = gidx[rank][lidx];
                            ++lidx;
                        } else {
                            ++rank;
                            lidx = 0;
                        }
                    } while (k < 0);

                    hdr->m_min[k].resize(ncomp);
                    hdr->m_max[k].resize(ncomp);

                    if (nbytes_on_rank[rank] < 0) { // First time for this rank
                        std::memcpy(&(nbytes_on_rank[rank]), pgd, sizeof(int64_t));
                        pgd += sizeof(int64_t);
                    }

                    int64_t nbytes;
                    std::memcpy(&nbytes, pgd, sizeof(int64_t));
                    pgd += sizeof(int64_t);

                    for (int icomp = 0; icomp < ncomp; ++icomp) {
                        Real cmin, cmax;
                        std::memcpy(&cmin, pgd             , sizeof(Real));
                        std::memcpy(&cmax, pgd+sizeof(Real), sizeof(Real));
                        pgd += sizeof(Real)*2;
                        hdr->m_min[k][icomp] = cmin;
                        hdr->m_max[k][icomp] = cmax;
                        hdr->m_famin[icomp] = std::min(hdr->m_famin[icomp],cmin);
                        hdr->m_famax[icomp] = std::max(hdr->m_famax[icomp],cmax);
                    }

                    auto info = AsyncOut::GetWriteInfo(rank);
                    hdr->m_fod[k].m_name = amrex::Concatenate(VisMF::BaseName(mf_name)+FabFileSuffix,
                                                              info.ifile, 5);
                    hdr->m_fod[k].m_head = nbytes;
                }
            }

            Vector<int64_t> offset(nprocs);
            for (int ip = 0; ip < nprocs; ++ip) {
                auto info = AsyncOut::GetWriteInfo(ip);
                if (info.ispot == 0) {
                    offset[ip] = 0;
                } else {
                    offset[ip] = offset[ip-1] + nbytes_on_rank[ip-1];
                }
            }

            for (int k = 0; k < n_global_fabs; ++k) {
                hdr->m_fod[k].m_head += offset[dm[k]];
            }

            VisMF::WriteHeaderDoit(mf_name, *hdr);
        }

        VisMF::IO_Buffer io_buffer(ioBufferSize);

        AsyncOut::Wait();  // Wait for my turn

        auto info = AsyncOut::GetWriteInfo(myproc);
        if (! myfabs->empty()) {
            std::string file_name = amrex::Concatenate(mf_name + FabFileSuffix, info.ifile, 5);
            std::ofstream ofs;
            ofs.rdbuf()->pubsetbuf(io_buffer.dataPtr(), io_buffer.size());
            ofs.open(file_name.c_str(), (info.ispot == 0) ? (std::ios::binary | std::ios::trunc)
                                                          : (std::ios::binary | std::ios::app));
            if (!ofs.good()) amrex::FileOpenFailed(file_name);
            for (auto const& fab : *myfabs) {
                fabio->write_header(ofs, fab, fab.nComp());
                fabio->write(ofs, fab, 0, fab.nComp());
            }
            ofs.flush();
            ofs.close();
        }

        AsyncOut::Notify();  // Notify others I am done
    });
}